

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O2

void __thiscall Object::anglePostCheck(Object *this,Vector2d *obs)

{
  double angle;
  pointer pEVar1;
  pointer pEVar2;
  int iVar3;
  bool bVar4;
  size_type sVar5;
  _Elt_pointer pMVar6;
  int k;
  Edge *this_00;
  long lVar7;
  int iVar8;
  Vector2d local_b8;
  Vector3d pt;
  Edge new_edge;
  
  pEVar1 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pEVar2 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = 0;
  do {
    if (lVar7 == ((long)pEVar1 - (long)pEVar2) / 0x60) {
      return;
    }
    this_00 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
              super__Vector_impl_data._M_start + lVar7;
    sVar5 = std::
            deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ::size(&this_00->
                    super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  );
    if (3 < sVar5) {
      angle = (((this_00->
                super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ).
                super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
              [2];
      sVar5 = std::
              deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::size(&this_00->
                      super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    );
      iVar3 = (int)sVar5 + -3;
      k = 2;
      do {
        iVar8 = iVar3;
        if ((int)sVar5 + -1 <= k) goto LAB_0010d20a;
        bVar4 = Edge::angleInRange(this_00,angle,k,k + 1);
        iVar3 = iVar8 + -1;
        k = k + 1;
      } while (!bVar4);
      Edge::Edge(&new_edge);
      if (iVar8 < 1) {
        iVar8 = 0;
      }
      while (bVar4 = iVar8 != 0, iVar8 = iVar8 + -1, bVar4) {
        pMVar6 = (this_00->
                 super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ).
                 super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pMVar6 == (this_00->
                      super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ).
                      super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pMVar6 = (this_00->
                   super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ).
                   super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
        }
        pt.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
             pMVar6[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[2];
        pt.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
             pMVar6[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[0];
        pt.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
             pMVar6[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[1];
        std::
        deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::pop_back(&this_00->
                    super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  );
        std::deque<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
        ::emplace_front<Eigen::Matrix<double,3,1,0,3,1>&>
                  ((deque<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                    *)&new_edge,&pt);
      }
      pMVar6 = (this_00->
               super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ).
               super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pMVar6 == (this_00->
                    super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ).
                    super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pMVar6 = (this_00->
                 super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ).
                 super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      std::deque<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
      emplace_front<Eigen::Matrix<double,3,1,0,3,1>&>
                ((deque<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)&new_edge,pMVar6 + -1);
      local_b8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [0] = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
            array[0];
      local_b8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [1] = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
            array[1];
      Edge::initWithObs(&new_edge,&local_b8);
      std::vector<Edge,_std::allocator<Edge>_>::push_back(&this->edges,&new_edge);
      std::
      _Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::~_Deque_base((_Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      *)&new_edge);
    }
LAB_0010d20a:
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void Object::anglePostCheck(const Eigen::Vector2d& obs) {
    size_t max_size = edges.size();
    for (size_t j = 0; j < max_size; j++) {
        Edge& eg = edges[j];
        if (eg.size() < 4) continue;
        double front_angle = eg.front().z();
        int size_1 = static_cast<int>(eg.size()) - 1, id = 2;
        bool break_judge = false;
        for (; id < size_1; id++) {
            if (eg.angleInRange(front_angle, id, id + 1) == false) continue;
            break_judge = true;
            break;
        }
        if (break_judge == false) continue;
        int pop_cnt = size_1 - id;
        Edge new_edge;
        for (int i = 0; i < pop_cnt; i++) {
            Eigen::Vector3d pt = eg.back();
            eg.pop_back();
            new_edge.emplace_front(pt);
        }
        new_edge.emplace_front(eg.back());
        new_edge.initWithObs(obs);
        edges.push_back(new_edge);
    }
}